

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O2

bool __thiscall
HookStateStepOut::Start(HookStateStepOut *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  bool bVar1;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = StackLevelBasedState::Start
                    (&this->super_StackLevelBasedState,(shared_ptr<Debugger> *)&_Stack_38,current);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  if (bVar1) {
    Debugger::ExitDebugMode
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return bVar1;
}

Assistant:

bool HookStateStepOut::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (!StackLevelBasedState::Start(debugger, current))
		return false;
	debugger->ExitDebugMode();
	return true;
}